

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

VkResult Fossilize::CreateRayTracingPipelinesKHR
                   (VkDevice device,VkDeferredOperationKHR deferredOperation,
                   VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkRayTracingPipelineCreateInfoKHR *pCreateInfos,VkAllocationCallbacks *pAllocator
                   ,VkPipeline *pPipelines)

{
  byte *pbVar1;
  Instance *pIVar2;
  int *piVar3;
  int *piVar4;
  undefined4 uVar5;
  bool bVar6;
  VkResult VVar7;
  VkResult VVar8;
  LogLevel LVar9;
  VkBaseInStructure *s;
  Device *this;
  VkRayTracingPipelineCreateInfoKHR *pVVar10;
  int *piVar11;
  ulong uVar12;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var13;
  int iVar14;
  long lVar15;
  VkResult extraout_EDX;
  ulong uVar16;
  uint32_t i_2;
  ulong uVar17;
  uint uVar18;
  VkPipeline pipeline;
  VkRayTracingPipelineCreateInfoKHR *pVVar19;
  uint32_t i;
  uint32_t i_1;
  bool bVar20;
  byte bVar21;
  VkResult local_dc;
  VkResult local_d8;
  VkRayTracingPipelineCreateInfoKHR local_98;
  
  bVar21 = 0;
  this = get_device_layer(device);
  pIVar2 = this->pInstance;
  if ((pIVar2->enableCrashHandler == false) && ((pIVar2->synchronized & 1U) == 0)) {
    if (createInfoCount == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = true;
      if (pIVar2->enablePrecompileQA != false) {
        uVar16 = (ulong)createInfoCount;
        uVar17 = 0;
        bVar20 = false;
        do {
          piVar11 = (int *)pCreateInfos[uVar17].pNext;
          for (piVar3 = piVar11; (piVar3 != (int *)0x0 && (*piVar3 != 0x3ba1f5f5));
              piVar3 = *(int **)(piVar3 + 2)) {
          }
          piVar4 = piVar11;
          if (piVar3 == (int *)0x0) {
            uVar18 = pCreateInfos[uVar17].flags;
          }
          else {
            uVar18 = (uint)*(undefined8 *)(piVar3 + 4);
          }
          for (; (piVar4 != (int *)0x0 && (*piVar4 != 0x3b9f36d0)); piVar4 = *(int **)(piVar4 + 2))
          {
          }
          for (; (piVar11 != (int *)0x0 && (*piVar11 != 0x3ba228ba));
              piVar11 = *(int **)(piVar11 + 2)) {
          }
          if ((piVar11 != (int *)0x0) && (piVar11[4] != 0)) break;
          if (piVar4 == (int *)0x0) {
            uVar18 = uVar18 >> 8 & 1;
          }
          else {
            if ((uVar18 >> 10 & 1) == 0 && piVar4[4] != 0) break;
            uVar18 = uVar18 & 0x100;
          }
          if (uVar18 != 0) break;
          uVar17 = uVar17 + 1;
          bVar20 = uVar16 <= uVar17;
        } while (uVar17 != uVar16);
        if (bVar20) {
          ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_98);
          pVVar10 = (VkRayTracingPipelineCreateInfoKHR *)
                    ScratchAllocator::allocate_raw((ScratchAllocator *)&local_98,uVar16 * 0x68,0x10)
          ;
          memcpy(pVVar10,pCreateInfos,uVar16 * 0x68);
          uVar17 = 0;
          do {
            pbVar1 = (byte *)((long)&pVVar10[uVar17].flags + 1);
            *pbVar1 = *pbVar1 | 1;
            bVar6 = shallowCopyPnextChain
                              ((ScratchAllocator *)&local_98,pVVar10[uVar17].pNext,
                               &pVVar10[uVar17].pNext);
            if (!bVar6) {
              bVar20 = false;
              goto LAB_00116644;
            }
            for (piVar11 = (int *)pVVar10[uVar17].pNext;
                (piVar11 != (int *)0x0 && (*piVar11 != 0x3ba1f5f5));
                piVar11 = *(int **)(piVar11 + 2)) {
            }
            if (piVar11 != (int *)0x0) {
              *(byte *)((long)piVar11 + 0x11) = *(byte *)((long)piVar11 + 0x11) | 1;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar16);
          VVar7 = (*this->pTable->CreateRayTracingPipelinesKHR)
                            (device,(VkDeferredOperationKHR)0x0,(VkPipelineCache)0x0,createInfoCount
                             ,pVVar10,pAllocator,pPipelines);
          if (VVar7 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
            uVar17 = 0;
            do {
              if (pPipelines[uVar17] == (VkPipeline)0x0) {
                for (piVar11 = (int *)pCreateInfos[uVar17].pNext;
                    (piVar11 != (int *)0x0 && (*piVar11 != 0x3ba1f5f5));
                    piVar11 = *(int **)(piVar11 + 2)) {
                }
                if (piVar11 == (int *)0x0) {
                  uVar12 = (ulong)pCreateInfos[uVar17].flags;
                }
                else {
                  uVar12 = *(ulong *)(piVar11 + 4);
                }
                LVar9 = get_thread_log_level();
                if ((int)LVar9 < 2) {
                  bVar6 = Internal::log_thread_callback
                                    (LOG_DEFAULT,
                                     "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                                    );
                  if (!bVar6) {
                    fprintf(_stderr,
                            "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                            ,uVar12 >> 0x20,uVar12);
                  }
                }
                Device::registerPrecompileQAFailure(this,1);
                if (this->usesModuleIdentifiers == true) {
                  p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
                }
                else {
                  p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
                }
                bVar6 = StateRecorder::record_raytracing_pipeline
                                  (this->recorder,pPipelines[uVar17],pCreateInfos + uVar17,
                                   pPipelines,createInfoCount,0,device,p_Var13);
                if (((!bVar6) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
                   (bVar6 = Internal::log_thread_callback
                                      (LOG_DEFAULT,
                                       "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                      ), !bVar6)) {
                  CreateRayTracingPipelinesKHR();
                }
              }
              else {
                Device::registerPrecompileQASuccess(this,1);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar16);
            uVar17 = 0;
            do {
              (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar17],pAllocator);
              pPipelines[uVar17] = (VkPipeline)0x0;
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
            bVar20 = false;
          }
          else {
            Device::registerPrecompileQASuccess(this,createInfoCount);
            bVar20 = VVar7 == VK_SUCCESS;
          }
LAB_00116644:
          ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_98);
          uVar12 = (ulong)(createInfoCount + (createInfoCount == 0));
          bVar6 = true;
          uVar17 = 0;
          do {
            for (piVar11 = (int *)pCreateInfos[uVar17].pNext;
                (piVar11 != (int *)0x0 && (*piVar11 != 0x3ba1f5f5));
                piVar11 = *(int **)(piVar11 + 2)) {
            }
            if (piVar11 == (int *)0x0) {
              uVar18 = pCreateInfos[uVar17].flags;
            }
            else {
              uVar18 = (uint)*(undefined8 *)(piVar11 + 4);
            }
            if ((uVar18 >> 0xb & 1) != 0) break;
            uVar17 = uVar17 + 1;
            bVar6 = uVar17 < uVar16;
          } while (uVar17 != uVar12);
          if (bVar20 && deferredOperation != (VkDeferredOperationKHR)0x0) {
            uVar17 = 0;
            do {
              (*this->pTable->DestroyPipeline)(device,pPipelines[uVar17],pAllocator);
              pPipelines[uVar17] = (VkPipeline)0x0;
              uVar17 = uVar17 + 1;
            } while (uVar12 != uVar17);
          }
        }
      }
    }
    VVar8 = (*this->pTable->CreateRayTracingPipelinesKHR)
                      (device,deferredOperation,pipelineCache,createInfoCount,pCreateInfos,
                       pAllocator,pPipelines);
    if ((((uint)(VVar8 + ~VK_THREAD_DONE_KHR) < 2) || (VVar8 == VK_SUCCESS)) &&
       (bVar6 == true && createInfoCount != 0)) {
      uVar17 = 0;
      do {
        if (this->usesModuleIdentifiers == true) {
          p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar6 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,pPipelines[uVar17],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var13);
        if (((!bVar6) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
           (bVar6 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar6)) {
          CreateRayTracingPipelinesKHR();
        }
        uVar17 = uVar17 + 1;
        pCreateInfos = pCreateInfos + 1;
      } while (createInfoCount != uVar17);
    }
  }
  else {
    if (createInfoCount == 0) {
      local_dc = VK_SUCCESS;
      bVar6 = true;
      VVar7 = extraout_EDX;
    }
    else {
      memset(pPipelines,0,(ulong)createInfoCount * 8);
      uVar17 = 0;
      local_dc = VK_SUCCESS;
      do {
        pVVar10 = pCreateInfos + uVar17;
        pVVar19 = &local_98;
        for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
          uVar5 = *(undefined4 *)&pVVar10->field_0x4;
          pVVar19->sType = pVVar10->sType;
          *(undefined4 *)&pVVar19->field_0x4 = uVar5;
          pVVar10 = (VkRayTracingPipelineCreateInfoKHR *)((long)pVVar10 + (ulong)bVar21 * -0x10 + 8)
          ;
          pVVar19 = (VkRayTracingPipelineCreateInfoKHR *)
                    ((long)pVVar19 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        if ((-1 < local_98.basePipelineIndex &
            local_98.basePipelineHandle == (VkPipeline)0x0 & (byte)local_98.flags >> 2) == 1) {
          local_98.basePipelineHandle = pPipelines[(uint)local_98.basePipelineIndex];
          local_98.basePipelineIndex = 0xffffffff;
        }
        if (this->pInstance->synchronized == true) {
          if (this->usesModuleIdentifiers == true) {
            p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
          }
          else {
            p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
          }
          bVar6 = StateRecorder::record_raytracing_pipeline
                            (this->recorder,(VkPipeline)0x0,&local_98,(VkPipeline *)0x0,0,0,device,
                             p_Var13);
          if (((!bVar6) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
             (bVar6 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
             !bVar6)) {
            CreateRayTracingPipelinesKHR();
          }
        }
        Instance::braceForRayTracingPipelineCrash(this->recorder,&local_98);
        VVar7 = (*this->pTable->CreateRayTracingPipelinesKHR)
                          (device,(VkDeferredOperationKHR)0x0,pipelineCache,1,&local_98,pAllocator,
                           pPipelines + uVar17);
        Instance::completedPipelineCompilation();
        pipeline = (VkPipeline)0x0;
        if (VVar7 == VK_SUCCESS) {
          pipeline = pPipelines[uVar17];
        }
        if (this->usesModuleIdentifiers == true) {
          p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar6 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,pipeline,&local_98,(VkPipeline *)0x0,0,0,device,p_Var13);
        if (((!bVar6) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
           (bVar6 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar6)) {
          CreateRayTracingPipelinesKHR();
        }
        if (VVar7 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
          local_dc = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
        }
        if (VVar7 < VK_SUCCESS) {
          iVar14 = 1;
          if (uVar17 == 0) {
            bVar6 = false;
          }
          else {
            uVar16 = 0;
            do {
              (*this->pTable->DestroyPipeline)(device,pPipelines[uVar16],pAllocator);
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
            bVar6 = false;
            iVar14 = 1;
          }
        }
        else if ((VVar7 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) &&
                ((local_98.flags._1_1_ & 2) != 0)) {
          iVar14 = 5;
          bVar6 = false;
          VVar7 = local_d8;
        }
        else {
          iVar14 = 0;
          bVar6 = true;
          VVar7 = local_d8;
        }
        if (!bVar6) goto LAB_001165b8;
        uVar17 = uVar17 + 1;
        local_d8 = VVar7;
      } while (uVar17 != createInfoCount);
      iVar14 = 5;
LAB_001165b8:
      bVar6 = iVar14 == 5;
    }
    VVar8 = VK_OPERATION_NOT_DEFERRED_KHR;
    if (local_dc != VK_SUCCESS) {
      VVar8 = local_dc;
    }
    if (deferredOperation == (VkDeferredOperationKHR)0x0) {
      VVar8 = local_dc;
    }
    if (!bVar6) {
      VVar8 = VVar7;
    }
  }
  return VVar8;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateRayTracingPipelinesKHR(
		VkDevice device, VkDeferredOperationKHR deferredOperation,
		VkPipelineCache pipelineCache, uint32_t createInfoCount,
		const VkRayTracingPipelineCreateInfoKHR *pCreateInfos,
		const VkAllocationCallbacks *pAllocator,
		VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
	{
		return CreateRayTracingPipelinesParanoid(layer, device, deferredOperation, pipelineCache,
		                                         createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
	else
	{
		return CreateRayTracingPipelinesNormal(layer, device, deferredOperation, pipelineCache,
		                                       createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
}